

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::VerifyLinkItemIsTarget
          (cmGeneratorTarget *this,LinkItemRole role,cmLinkItem *item)

{
  size_t *psVar1;
  undefined8 uVar2;
  char *this_00;
  bool bVar3;
  uint uVar4;
  int iVar5;
  string *psVar6;
  long lVar7;
  cmake *this_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string e;
  cmListFileBacktrace backtrace;
  undefined1 local_e8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  size_type local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  char *local_88;
  ulong local_80;
  char *local_78;
  _Alloc_hider local_70;
  char *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined8 local_50;
  char *local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  if (item->Target != (cmGeneratorTarget *)0x0) {
    return true;
  }
  psVar6 = cmLinkItem::AsStr_abi_cxx11_(item);
  if (psVar6->_M_string_length != 0) {
    uVar4 = (byte)*(psVar6->_M_dataplus)._M_p - 0x24;
    if ((uVar4 < 0x3d) && ((0x1000000000000201U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
      return true;
    }
    lVar7 = std::__cxx11::string::find_first_of((char *)psVar6,0x6c910c,0);
    if (lVar7 != -1) {
      return true;
    }
    local_b0._M_str = (psVar6->_M_dataplus)._M_p;
    local_b0._M_len = psVar6->_M_string_length;
    __str._M_str = "<LINK_LIBRARY:";
    __str._M_len = 0xe;
    iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_b0,0,0xe,__str);
    if (iVar5 == 0) {
      return true;
    }
    local_b0._M_str = (psVar6->_M_dataplus)._M_p;
    local_b0._M_len = psVar6->_M_string_length;
    __str_00._M_str = "<LINK_GROUP:";
    __str_00._M_len = 0xc;
    iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_b0,0,0xc,__str_00)
    ;
    if (iVar5 == 0) {
      return true;
    }
  }
  local_e8._16_8_ = this;
  psVar6 = cmTarget::GetName_abi_cxx11_(this->Target);
  local_98 = (_Base_ptr)(psVar6->_M_dataplus)._M_p;
  local_a0 = psVar6->_M_string_length;
  local_78 = "its link interface contains";
  if (role == Implementation) {
    local_78 = "it links to";
  }
  psVar6 = cmLinkItem::AsStr_abi_cxx11_(item);
  local_b0._M_len = 8;
  local_b0._M_str = "Target \"";
  local_90 = (_Base_ptr)0x2f;
  local_88 = "\" has LINK_LIBRARIES_ONLY_TARGETS enabled, but ";
  local_80 = (ulong)(role != Implementation) << 4 | 0xb;
  local_70._M_p = (pointer)0x4;
  local_68 = ":\n  ";
  local_60._8_8_ = (psVar6->_M_dataplus)._M_p;
  local_60._M_allocated_capacity = psVar6->_M_string_length;
  local_50 = 0x19;
  local_40 = (_Base_ptr)0x9d;
  if (_ZN12_GLOBAL__N_128missingTargetPossibleReasonsE_0 == '\0') {
    local_40 = (_Base_ptr)0x0;
  }
  local_48 = "\nwhich is not a target.  ";
  local_38 = _ZN12_GLOBAL__N_128missingTargetPossibleReasonsE_1;
  views._M_len = 8;
  views._M_array = &local_b0;
  cmCatViews_abi_cxx11_((string *)(local_e8 + 0x18),views);
  local_b0._M_len =
       (size_t)(item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
  local_b0._M_str =
       (char *)(item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  if ((cmMakefile *)local_b0._M_str != (cmMakefile *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &(((cmMakefile *)local_b0._M_str)->FindPackageRootPathStack).
                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
    }
    else {
      psVar1 = &(((cmMakefile *)local_b0._M_str)->FindPackageRootPathStack).
                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_map_size;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
  }
  bVar3 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_b0);
  uVar2 = local_e8._16_8_;
  if (bVar3) {
    GetBacktrace((cmGeneratorTarget *)local_e8);
    this_00 = local_b0._M_str;
    local_b0._M_str = (char *)local_e8._8_8_;
    local_b0._M_len = local_e8._0_8_;
    local_e8._0_8_ = (element_type *)0x0;
    local_e8._8_8_ = (cmMakefile *)0x0;
    if ((cmMakefile *)this_00 != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
    if ((cmMakefile *)local_e8._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
    }
  }
  this_01 = cmLocalGenerator::GetCMakeInstance(*(cmLocalGenerator **)(uVar2 + 0x10));
  cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_e8 + 0x18),
                      (cmListFileBacktrace *)&local_b0);
  if ((cmMakefile *)local_b0._M_str != (cmMakefile *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_str);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._24_8_ != &local_c0) {
    operator_delete((void *)local_e8._24_8_,local_c0._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::VerifyLinkItemIsTarget(LinkItemRole role,
                                               cmLinkItem const& item) const
{
  if (item.Target) {
    return true;
  }
  std::string const& str = item.AsStr();
  if (!str.empty() &&
      (str[0] == '-' || str[0] == '$' || str[0] == '`' ||
       str.find_first_of("/\\") != std::string::npos ||
       cmHasPrefix(str, "<LINK_LIBRARY:"_s) ||
       cmHasPrefix(str, "<LINK_GROUP:"_s))) {
    return true;
  }

  std::string e = cmStrCat("Target \"", this->GetName(),
                           "\" has LINK_LIBRARIES_ONLY_TARGETS enabled, but ",
                           role == LinkItemRole::Implementation
                             ? "it links to"
                             : "its link interface contains",
                           ":\n  ", item.AsStr(), "\nwhich is not a target.  ",
                           missingTargetPossibleReasons);
  cmListFileBacktrace backtrace = item.Backtrace;
  if (backtrace.Empty()) {
    backtrace = this->GetBacktrace();
  }
  this->LocalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e, backtrace);
  return false;
}